

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.h
# Opt level: O2

void __thiscall
ktx::
Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
::~Combine(Combine<ktx::CommandExtract::OptionsExtract,_ktx::OptionsTranscodeTarget<false>,_ktx::OptionsSingleIn,_ktx::OptionsGeneric>
           *this)

{
  std::__cxx11::string::~string((string *)&this->super_OptionsSingleIn);
  OptionsTranscodeTarget<false>::~OptionsTranscodeTarget(&this->super_OptionsTranscodeTarget<false>)
  ;
  CommandExtract::OptionsExtract::~OptionsExtract(&this->super_OptionsExtract);
  return;
}

Assistant:

void init(cxxopts::Options& opts) {
        (Args::init(opts), ...);
    }